

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoa.h
# Opt level: O0

size_t floaxie::ftoa<float,char>(float v,char *buffer)

{
  bool bVar1;
  uint uVar2;
  int local_34;
  uint local_30;
  int K;
  int len;
  uint decimal_scientific_threshold;
  int gamma;
  int alpha;
  char *buffer_local;
  size_t sStack_10;
  float v_local;
  
  _gamma = buffer;
  buffer_local._4_4_ = v;
  uVar2 = std::isnan((double)(ulong)(uint)v);
  if ((uVar2 & 1) == 0) {
    uVar2 = std::isinf((double)(ulong)(uint)buffer_local._4_4_);
    if ((uVar2 & 1) == 0) {
      if ((buffer_local._4_4_ != 0.0) || (NAN(buffer_local._4_4_))) {
        *_gamma = '-';
        _gamma = _gamma + (int)(uint)(buffer_local._4_4_ < 0.0);
        decimal_scientific_threshold = 0xffffffed;
        len = -0x10;
        K = 0x10;
        grisu2<_19,_16,float,char>(buffer_local._4_4_,_gamma,(int *)&local_30,&local_34);
        bVar1 = buffer_local._4_4_ < 0.0;
        sStack_10 = prettify<16ul,char>(_gamma,local_30,local_34);
        sStack_10 = bVar1 + sStack_10;
      }
      else {
        *_gamma = '0';
        _gamma[1] = '\0';
        sStack_10 = 1;
      }
    }
    else if (buffer_local._4_4_ <= 0.0) {
      builtin_strncpy(_gamma,"-inf",5);
      sStack_10 = 4;
    }
    else {
      builtin_strncpy(_gamma,"inf",4);
      sStack_10 = 3;
    }
  }
  else {
    builtin_strncpy(_gamma,"nan",4);
    sStack_10 = 3;
  }
  return sStack_10;
}

Assistant:

inline std::size_t ftoa(FloatType v, CharType* buffer) noexcept
	{
		if (std::isnan(v))
		{
			buffer[0] = 'n';
			buffer[1] = 'a';
			buffer[2] = 'n';
			buffer[3] = '\0';

			return 3;
		}
		else if (std::isinf(v))
		{
			if (v > 0)
			{
				buffer[0] = 'i';
				buffer[1] = 'n';
				buffer[2] = 'f';
				buffer[3] = '\0';

				return 3;
			}
			else
			{
				buffer[0] = '-';
				buffer[1] = 'i';
				buffer[2] = 'n';
				buffer[3] = 'f';
				buffer[4] = '\0';

				return 4;
			}
		}
		else if (v == 0)
		{
			buffer[0] = '0';
			buffer[1] = '\0';

			return 1;
		}
		else
		{
			*buffer = '-';
			buffer += v < 0;

			constexpr int alpha(grisu_parameters<FloatType>.alpha), gamma(grisu_parameters<FloatType>.gamma);
			constexpr unsigned int decimal_scientific_threshold(16);

			int len, K;

			grisu2<alpha, gamma>(v, buffer, &len, &K);
			return (v < 0) + prettify<decimal_scientific_threshold>(buffer, len, K);
		}
	}